

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::TEST_CompactMemTable(DBImpl *this)

{
  bool bVar1;
  long *in_RSI;
  bool local_41;
  MutexLock local_28;
  MutexLock l;
  DBImpl *this_local;
  Status *s;
  
  l.mu_._7_1_ = 0;
  memset((void *)((long)&l.mu_ + 6),0,1);
  WriteOptions::WriteOptions((WriteOptions *)((long)&l.mu_ + 6));
  (**(code **)(*in_RSI + 0x20))(this,in_RSI,(undefined1 *)((long)&l.mu_ + 6),0);
  bVar1 = Status::ok((Status *)this);
  if (bVar1) {
    MutexLock::MutexLock(&local_28,(Mutex *)(in_RSI + 0x19));
    while( true ) {
      local_41 = false;
      if (in_RSI[0x27] != 0) {
        local_41 = Status::ok((Status *)(in_RSI + 0x46));
      }
      if (local_41 == false) break;
      port::CondVar::Wait((CondVar *)(in_RSI + 0x1f));
    }
    if (in_RSI[0x27] != 0) {
      Status::operator=((Status *)this,(Status *)(in_RSI + 0x46));
    }
    MutexLock::~MutexLock(&local_28);
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::TEST_CompactMemTable() {
  // nullptr batch means just wait for earlier writes to be done
  Status s = Write(WriteOptions(), nullptr);
  if (s.ok()) {
    // Wait until the compaction completes
    MutexLock l(&mutex_);
    while (imm_ != nullptr && bg_error_.ok()) {
      background_work_finished_signal_.Wait();
    }
    if (imm_ != nullptr) {
      s = bg_error_;
    }
  }
  return s;
}